

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

ssh_key * ecdsa_new_pub(ssh_keyalg *alg,ptrlen data)

{
  _Bool _Var1;
  ec_curve *curve;
  undefined8 *puVar2;
  WeierstrassPoint *pWVar3;
  ptrlen pl;
  BinarySource src [1];
  BinarySource local_58;
  
  curve = (ec_curve *)(**alg->extra)();
  if (curve->type != EC_WEIERSTRASS) {
    __assert_fail("curve->type == EC_WEIERSTRASS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                  ,0x278,"ssh_key *ecdsa_new_pub(const ssh_keyalg *, ptrlen)");
  }
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.data = data.ptr;
  local_58.len = data.len;
  local_58.binarysource_ = &local_58;
  BinarySource_get_string(&local_58);
  pl = BinarySource_get_string(local_58.binarysource_);
  _Var1 = ptrlen_eq_string(pl,curve->name);
  if (_Var1) {
    puVar2 = (undefined8 *)safemalloc(1,0x20,0);
    puVar2[3] = alg;
    *puVar2 = curve;
    puVar2[2] = 0;
    pWVar3 = BinarySource_get_wpoint(local_58.binarysource_,curve);
    puVar2[1] = pWVar3;
    if (pWVar3 != (WeierstrassPoint *)0x0) {
      return (ssh_key *)(puVar2 + 3);
    }
    ecdsa_freekey((ssh_key *)(puVar2 + 3));
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *ecdsa_new_pub(const ssh_keyalg *alg, ptrlen data)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_WEIERSTRASS);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, data);
    get_string(src);

    /* Curve name is duplicated for Weierstrass form */
    if (!ptrlen_eq_string(get_string(src), curve->name))
        return NULL;

    struct ecdsa_key *ek = snew(struct ecdsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = get_wpoint(src, curve);
    if (!ek->publicKey) {
        ecdsa_freekey(&ek->sshk);
        return NULL;
    }

    return &ek->sshk;
}